

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

int match1by1(Abc_Ntk_t *pNtk1,Vec_Ptr_t **nodesInLevel1,Vec_Int_t **iMatch1,Vec_Int_t **iDep1,
             Vec_Int_t *matchedInputs1,int *iGroup1,Vec_Int_t **oMatch1,int *oGroup1,
             Abc_Ntk_t *pNtk2,Vec_Ptr_t **nodesInLevel2,Vec_Int_t **iMatch2,Vec_Int_t **iDep2,
             Vec_Int_t *matchedInputs2,int *iGroup2,Vec_Int_t **oMatch2,int *oGroup2,
             Vec_Int_t *matchedOutputs1,Vec_Int_t *matchedOutputs2,Vec_Int_t *oMatchedGroups,
             Vec_Int_t *iNonSingleton,int ii,int idx)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p;
  int *piVar6;
  Vec_Ptr_t *oMatchPairs;
  void **ppvVar7;
  void *__s;
  Abc_Ntk_t *pNtk2_00;
  Vec_Int_t *mismatch;
  Abc_Ntk_t *pNtk1_00;
  int *piVar8;
  Vec_Int_t *p_00;
  int *piVar9;
  Vec_Int_t *p_01;
  void *pvVar10;
  Vec_Int_t *pVVar11;
  Abc_Ntk_t *pAVar12;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVVar13;
  Vec_Int_t *pVVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  Abc_Obj_t *local_68;
  ulong local_60;
  ulong local_58;
  int *local_50;
  Vec_Int_t *local_48;
  int *local_40;
  Abc_Ntk_t *local_38;
  
  match1by1_MATCH_FOUND = 0;
  uVar15 = iNonSingleton->nSize;
  if (uVar15 != ii) {
    uVar22 = (ulong)(uint)idx;
    uVar24 = (ulong)(uint)ii;
    do {
      if ((ii < 0) || ((int)uVar15 <= (int)uVar24)) goto LAB_0029d07c;
      iVar5 = iNonSingleton->pArray[uVar24];
      pVVar14 = iMatch1[iVar5];
      iVar21 = (int)uVar22;
      if (pVVar14->nSize != iVar21) {
        local_58 = uVar24;
        local_50 = iGroup1;
        p = (Vec_Int_t *)malloc(0x10);
        p->nCap = 0x10;
        p->nSize = 0;
        piVar6 = (int *)malloc(0x40);
        p->pArray = piVar6;
        oMatchPairs = (Vec_Ptr_t *)malloc(0x10);
        oMatchPairs->nCap = 100;
        oMatchPairs->nSize = 0;
        ppvVar7 = (void **)malloc(800);
        oMatchPairs->pArray = ppvVar7;
        iVar18 = pVVar14->nSize;
        sVar1 = (long)iVar18 * 4;
        __s = malloc(sVar1);
        if (0 < (long)iVar18) {
          memset(__s,0,sVar1);
        }
        if ((iVar21 < 0) || (iVar18 <= iVar21)) goto LAB_0029d07c;
        Vec_IntPush(matchedInputs1,pVVar14->pArray[uVar22]);
        if (iVar21 != 0) goto LAB_0029c36b;
        pVVar14 = iMatch1[iVar5];
        uVar15 = pVVar14->nSize;
        if ((int)uVar15 < 1) goto LAB_0029d03e;
        lVar19 = 0;
        goto LAB_0029cf2b;
      }
      uVar24 = uVar24 + 1;
      uVar22 = 0;
    } while (uVar15 != uVar24);
  }
  match1by1_MATCH_FOUND = 1;
  return 1;
LAB_0029cf2b:
  do {
    if (iDep1[pVVar14->pArray[(ulong)uVar15 - 1]]->nSize <= lVar19) goto LAB_0029c36b;
    iVar18 = oGroup1[iDep1[pVVar14->pArray[(ulong)uVar15 - 1]]->pArray[lVar19]];
    if (oMatch1[iVar18]->nSize != 1) {
      if (0 < (long)oMatchedGroups->nSize) {
        lVar17 = 0;
        do {
          if (oMatchedGroups->pArray[lVar17] == iVar18) goto LAB_0029d030;
          lVar17 = lVar17 + 1;
        } while (oMatchedGroups->nSize != lVar17);
      }
      if (0 < (long)p->nSize) {
        lVar17 = 0;
        do {
          if (p->pArray[lVar17] == iVar18) goto LAB_0029cfcb;
          lVar17 = lVar17 + 1;
        } while (p->nSize != lVar17);
      }
      Vec_IntPush(p,iVar18);
      pVVar14 = iMatch1[iVar5];
LAB_0029cfcb:
      if ((long)pVVar14->nSize < 1) break;
      if (iDep1[pVVar14->pArray[(long)pVVar14->nSize + -1]]->nSize <= lVar19) goto LAB_0029d07c;
      if (0 < (long)oMatchedGroups->nSize) {
        lVar17 = 0;
        do {
          if (oMatchedGroups->pArray[lVar17] ==
              oGroup1[iDep1[pVVar14->pArray[(long)pVVar14->nSize + -1]]->pArray[lVar19]])
          goto LAB_0029d030;
          lVar17 = lVar17 + 1;
        } while (oMatchedGroups->nSize != lVar17);
      }
      Vec_IntPush(oMatchedGroups,
                  oGroup1[iDep1[pVVar14->pArray[(long)pVVar14->nSize + -1]]->pArray[lVar19]]);
      pVVar14 = iMatch1[iVar5];
    }
LAB_0029d030:
    lVar19 = lVar19 + 1;
    uVar15 = pVVar14->nSize;
  } while (0 < (int)uVar15);
LAB_0029d03e:
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
LAB_0029c36b:
  pNtk2_00 = computeCofactor(pNtk1,nodesInLevel1,(int *)0x0,matchedInputs1);
  pVVar14 = iMatch2[iVar5];
  if (iVar21 < pVVar14->nSize && (match1by1_MATCH_FOUND & 1) == 0) {
    local_60 = (ulong)(iVar21 + 1);
    uVar24 = uVar22;
    local_48 = matchedInputs1;
    do {
      if (*(int *)((long)__s + uVar24 * 4) == 0) {
        mismatch = (Vec_Int_t *)malloc(0x10);
        mismatch->nCap = 0x10;
        mismatch->nSize = 0;
        piVar6 = (int *)malloc(0x40);
        mismatch->pArray = piVar6;
        iVar18 = (int)uVar24;
        if ((iVar18 < 0) || (pVVar14->nSize <= iVar18)) goto LAB_0029d07c;
        Vec_IntPush(matchedInputs2,pVVar14->pArray[uVar24]);
        pNtk1_00 = computeCofactor(pNtk2,nodesInLevel2,(int *)0x0,matchedInputs2);
        if (0 < matchedOutputs1->nSize) {
          lVar19 = 0;
          do {
            iVar4 = matchedOutputs1->pArray[lVar19];
            if (((long)iVar4 < 0) || (pNtk2_00->vPos->nSize <= iVar4)) {
LAB_0029d05d:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar10 = pNtk2_00->vPos->pArray[iVar4];
            uVar15 = oMatchPairs->nCap;
            uVar16 = oMatchPairs->nSize;
            if (uVar16 == uVar15) {
              if ((int)uVar16 < 0x10) {
                if (oMatchPairs->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(oMatchPairs->pArray,0x80);
                }
                uVar15 = 0x10;
              }
              else {
                uVar15 = uVar16 * 2;
                if (oMatchPairs->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar16 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(oMatchPairs->pArray,(ulong)uVar16 << 4);
                }
              }
              oMatchPairs->pArray = ppvVar7;
              oMatchPairs->nCap = uVar15;
              uVar16 = oMatchPairs->nSize;
            }
            else {
              ppvVar7 = oMatchPairs->pArray;
            }
            oMatchPairs->nSize = uVar16 + 1;
            ppvVar7[(int)uVar16] = pvVar10;
            if (matchedOutputs2->nSize <= lVar19) goto LAB_0029d07c;
            iVar4 = matchedOutputs2->pArray[lVar19];
            if (((long)iVar4 < 0) || (pNtk1_00->vPos->nSize <= iVar4)) goto LAB_0029d05d;
            pvVar10 = pNtk1_00->vPos->pArray[iVar4];
            if (uVar16 + 1 == uVar15) {
              if ((int)uVar16 < 0xf) {
                if (oMatchPairs->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(oMatchPairs->pArray,0x80);
                }
                oMatchPairs->pArray = ppvVar7;
                oMatchPairs->nCap = 0x10;
              }
              else {
                sVar1 = (ulong)(uVar15 * 2) * 8;
                if (oMatchPairs->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(sVar1);
                }
                else {
                  ppvVar7 = (void **)realloc(oMatchPairs->pArray,sVar1);
                }
                oMatchPairs->pArray = ppvVar7;
                oMatchPairs->nCap = uVar15 * 2;
              }
            }
            else {
              ppvVar7 = oMatchPairs->pArray;
            }
            iVar4 = oMatchPairs->nSize;
            oMatchPairs->nSize = iVar4 + 1;
            ppvVar7[iVar4] = pvVar10;
            lVar19 = lVar19 + 1;
          } while (lVar19 < matchedOutputs1->nSize);
        }
        match1by1::counter = match1by1::counter + 1;
        iVar4 = Abc_NtkBmSat(pNtk1_00,pNtk2_00,(Vec_Ptr_t *)0x0,oMatchPairs,mismatch,0);
        if (iVar4 == 0) {
          pVVar13 = pNtk1->vPis;
          iVar18 = pVVar13->nSize;
          piVar6 = (int *)malloc((long)iVar18 * 4);
          piVar8 = (int *)malloc((long)pNtk2->vPis->nSize << 2);
          p_00 = (Vec_Int_t *)malloc(0x10);
          p_00->nCap = 0x10;
          p_00->nSize = 0;
          piVar9 = (int *)malloc(0x40);
          p_00->pArray = piVar9;
          p_01 = (Vec_Int_t *)malloc(0x10);
          p_01->nCap = 0x10;
          p_01->nSize = 0;
          piVar9 = (int *)malloc(0x40);
          p_01->pArray = piVar9;
          pVVar14 = iMatch2[iVar5];
          iVar4 = pVVar14->nSize;
          pvVar10 = malloc((long)(iVar4 - iVar21) << 2);
          if (0 < (long)iVar18) {
            lVar19 = 0;
            do {
              piVar6[lVar19] = 0;
              piVar8[lVar19] = 0;
              lVar19 = lVar19 + 1;
            } while (lVar19 < pVVar13->nSize);
            iVar4 = pVVar14->nSize;
          }
          if (iVar4 - iVar21 != 0 && iVar21 <= iVar4) {
            memset(pvVar10,0,(ulong)(uint)(iVar4 - iVar21) << 2);
          }
          pVVar14 = local_48;
          iVar18 = mismatch->nSize;
          if (0 < (long)iVar18) {
            piVar9 = mismatch->pArray;
            uVar20 = 1;
            do {
              if ((ulong)(long)iVar18 <= uVar20) goto LAB_0029d07c;
              uVar15 = piVar9[uVar20 - 1];
              if ((((int)uVar15 < 0) || (local_48->nSize <= (int)uVar15)) ||
                 (piVar6[local_48->pArray[uVar15]] = piVar9[uVar20],
                 matchedInputs2->nSize <= (int)uVar15)) goto LAB_0029d07c;
              piVar8[matchedInputs2->pArray[uVar15]] = piVar9[uVar20];
              iVar4 = (int)uVar20;
              uVar20 = uVar20 + 2;
            } while (iVar4 + 1 < iVar18);
          }
          pVVar11 = iMatch1[iVar5];
          uVar20 = uVar22;
          local_40 = piVar8;
          if (iVar21 < pVVar11->nSize) {
            do {
              Vec_IntPush(p_00,pVVar11->pArray[uVar20]);
              if (iMatch2[iVar5]->nSize <= (int)uVar20) goto LAB_0029d07c;
              Vec_IntPush(p_01,iMatch2[iVar5]->pArray[uVar20]);
              uVar20 = uVar20 + 1;
              pVVar11 = iMatch1[iVar5];
            } while ((int)uVar20 < pVVar11->nSize);
            pVVar13 = pNtk1->vPis;
          }
          if (0 < pVVar13->nSize) {
            iVar18 = 0;
            do {
              lVar19 = (long)pVVar14->nSize;
              if (0 < lVar19) {
                lVar17 = 0;
                do {
                  if (pVVar14->pArray[lVar17] == iVar18) goto LAB_0029c961;
                  lVar17 = lVar17 + 1;
                } while (lVar19 != lVar17);
              }
              if (0 < (long)p_00->nSize) {
                lVar19 = 0;
                do {
                  if (p_00->pArray[lVar19] == iVar18) goto LAB_0029c961;
                  lVar19 = lVar19 + 1;
                } while (p_00->nSize != lVar19);
              }
              Vec_IntPush(p_00,iVar18);
LAB_0029c961:
              if (0 < (long)matchedInputs2->nSize) {
                lVar19 = 0;
                do {
                  if (matchedInputs2->pArray[lVar19] == iVar18) goto LAB_0029c9ab;
                  lVar19 = lVar19 + 1;
                } while (matchedInputs2->nSize != lVar19);
              }
              if (0 < (long)p_01->nSize) {
                lVar19 = 0;
                do {
                  if (p_01->pArray[lVar19] == iVar18) goto LAB_0029c9ab;
                  lVar19 = lVar19 + 1;
                } while (p_01->nSize != lVar19);
              }
              Vec_IntPush(p_01,iVar18);
LAB_0029c9ab:
              iVar18 = iVar18 + 1;
            } while (iVar18 < pNtk1->vPis->nSize);
          }
          pAVar12 = computeCofactor(pNtk1,nodesInLevel1,piVar6,p_00);
          pNtk = computeCofactor(pNtk2,nodesInLevel2,local_40,p_01);
          pVVar13 = pAVar12->vPos;
          local_38 = pAVar12;
          if (pVVar13->nSize < 1) {
            iVar18 = 0;
          }
          else {
            uVar20 = 0;
            iVar18 = 0;
            do {
              local_68 = (Abc_Obj_t *)pVVar13->pArray[uVar20];
              pVVar13 = Abc_NtkNodeSupport(local_38,&local_68,1);
              ppvVar7 = pVVar13->pArray;
              if (0 < (long)pVVar13->nSize) {
                lVar19 = 0;
                do {
                  if (*(int *)((long)ppvVar7[lVar19] + 0x10) == 1) {
                    iVar4 = 0;
                    if (0 < (long)matchedOutputs1->nSize) {
                      lVar17 = 0;
                      do {
                        if (uVar20 == (uint)matchedOutputs1->pArray[lVar17]) {
                          iVar4 = (int)lVar17 + 1;
                          break;
                        }
                        lVar17 = lVar17 + 1;
                      } while (matchedOutputs1->nSize != lVar17);
                    }
                    iVar18 = iVar18 + iVar4;
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 != pVVar13->nSize);
              }
              if (ppvVar7 != (void **)0x0) {
                free(ppvVar7);
              }
              free(pVVar13);
              uVar20 = uVar20 + 1;
              pVVar13 = local_38->vPos;
            } while ((long)uVar20 < (long)pVVar13->nSize);
          }
          pVVar13 = pNtk->vPos;
          if (0 < pVVar13->nSize) {
            uVar20 = 0;
            do {
              local_68 = (Abc_Obj_t *)pVVar13->pArray[uVar20];
              pVVar13 = Abc_NtkNodeSupport(pNtk,&local_68,1);
              iVar4 = pVVar13->nSize;
              ppvVar7 = pVVar13->pArray;
              if (0 < (long)iVar4) {
                iVar2 = iMatch2[iVar5]->nSize;
                lVar19 = 0;
                do {
                  iVar3 = *(int *)((long)ppvVar7[lVar19] + 0x10);
                  if ((0 < iVar3) && (iVar3 <= iVar2 - iVar21)) {
                    iVar23 = 0;
                    if (0 < (long)matchedOutputs2->nSize) {
                      lVar17 = 0;
                      do {
                        if (uVar20 == (uint)matchedOutputs2->pArray[lVar17]) {
                          iVar23 = (int)lVar17 + 1;
                          break;
                        }
                        lVar17 = lVar17 + 1;
                      } while (matchedOutputs2->nSize != lVar17);
                    }
                    piVar8 = (int *)((long)pvVar10 + (ulong)(iVar3 - 1) * 4);
                    *piVar8 = *piVar8 + iVar23;
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 != iVar4);
              }
              if (ppvVar7 != (void **)0x0) {
                free(ppvVar7);
              }
              free(pVVar13);
              uVar20 = uVar20 + 1;
              pVVar13 = pNtk->vPos;
            } while ((long)uVar20 < (long)pVVar13->nSize);
          }
          matchedInputs1 = local_48;
          uVar15 = iMatch2[iVar5]->nSize - iVar21;
          if (uVar15 != 0 && iVar21 <= iMatch2[iVar5]->nSize) {
            uVar20 = 0;
            do {
              if (*(int *)((long)pvVar10 + uVar20 * 4) != iVar18) {
                *(undefined4 *)((long)__s + (long)(iVar21 + (int)uVar20) * 4) = 1;
              }
              uVar20 = uVar20 + 1;
            } while (uVar15 != uVar20);
          }
          Abc_NtkDelete(local_38);
          Abc_NtkDelete(pNtk);
          if (piVar6 != (int *)0x0) {
            free(piVar6);
          }
          if (local_40 != (int *)0x0) {
            free(local_40);
          }
          if (p_00->pArray != (int *)0x0) {
            free(p_00->pArray);
          }
          free(p_00);
          if (p_01->pArray != (int *)0x0) {
            free(p_01->pArray);
          }
          free(p_01);
          if (pvVar10 != (void *)0x0) {
            free(pvVar10);
          }
        }
        else if (uVar24 == uVar22) {
          matchNonSingletonOutputs
                    (pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,local_50,oMatch1,oGroup1,pNtk2
                     ,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                     matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,pNtk2_00,pNtk1_00,
                     oMatchPairs,p,0,0,(int)local_58,(int)local_60);
        }
        else {
          pVVar14 = iMatch2[iVar5];
          if ((pVVar14->nSize <= iVar21) || (pVVar14->nSize <= iVar18)) {
LAB_0029d07c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar6 = pVVar14->pArray;
          iVar4 = piVar6[uVar22];
          piVar6[uVar22] = piVar6[uVar24];
          if (pVVar14->nSize <= iVar18) {
LAB_0029d0ba:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          piVar6[uVar24] = iVar4;
          matchNonSingletonOutputs
                    (pNtk1,nodesInLevel1,iMatch1,iDep1,matchedInputs1,local_50,oMatch1,oGroup1,pNtk2
                     ,nodesInLevel2,iMatch2,iDep2,matchedInputs2,iGroup2,oMatch2,oGroup2,
                     matchedOutputs1,matchedOutputs2,oMatchedGroups,iNonSingleton,pNtk2_00,pNtk1_00,
                     oMatchPairs,p,0,0,(int)local_58,(int)local_60);
          pVVar14 = iMatch2[iVar5];
          if ((pVVar14->nSize <= iVar21) || (pVVar14->nSize <= iVar18)) goto LAB_0029d07c;
          piVar6 = pVVar14->pArray;
          iVar4 = piVar6[uVar22];
          piVar6[uVar22] = piVar6[uVar24];
          if (pVVar14->nSize <= iVar18) goto LAB_0029d0ba;
          piVar6[uVar24] = iVar4;
        }
        oMatchPairs->nSize = 0;
        Abc_NtkDelete(pNtk1_00);
        if (mismatch->pArray != (int *)0x0) {
          free(mismatch->pArray);
        }
        free(mismatch);
        if (match1by1_MATCH_FOUND != 0) goto LAB_0029ce9b;
        if (matchedInputs2->nSize < 1) goto LAB_0029d09b;
        matchedInputs2->nSize = matchedInputs2->nSize + -1;
      }
      uVar24 = uVar24 + 1;
      pVVar14 = iMatch2[iVar5];
    } while ((int)uVar24 < pVVar14->nSize);
  }
  else if ((match1by1_MATCH_FOUND & 1) != 0) goto LAB_0029ce9b;
  if (matchedInputs1->nSize < 1) {
LAB_0029d09b:
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
  }
  matchedInputs1->nSize = matchedInputs1->nSize + -1;
  if ((iVar21 == 0) && (iVar5 = p->nSize, 0 < iVar5)) {
    uVar15 = oMatchedGroups->nSize;
    uVar16 = (int)uVar15 >> 0x1f & uVar15;
    do {
      uVar15 = uVar15 - 1;
      if (uVar15 - uVar16 == -1) goto LAB_0029d09b;
      oMatchedGroups->nSize = uVar15;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
LAB_0029ce9b:
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  if (oMatchPairs->pArray != (void **)0x0) {
    free(oMatchPairs->pArray);
  }
  free(oMatchPairs);
  if (__s != (void *)0x0) {
    free(__s);
  }
  Abc_NtkDelete(pNtk2_00);
  if ((match1by1_MATCH_FOUND == 1) && (match1by1::counter != 0)) {
    match1by1::counter = 0;
  }
  return (uint)match1by1_MATCH_FOUND;
}

Assistant:

int match1by1(Abc_Ntk_t * pNtk1, Vec_Ptr_t ** nodesInLevel1, Vec_Int_t ** iMatch1, Vec_Int_t ** iDep1, Vec_Int_t * matchedInputs1, int * iGroup1, Vec_Int_t ** oMatch1, int * oGroup1,
               Abc_Ntk_t * pNtk2, Vec_Ptr_t ** nodesInLevel2, Vec_Int_t ** iMatch2, Vec_Int_t ** iDep2, Vec_Int_t * matchedInputs2, int * iGroup2, Vec_Int_t ** oMatch2, int * oGroup2,
               Vec_Int_t * matchedOutputs1, Vec_Int_t * matchedOutputs2, Vec_Int_t * oMatchedGroups, Vec_Int_t * iNonSingleton, int ii, int idx)
{
    static int MATCH_FOUND = FALSE;
    Abc_Ntk_t * subNtk1, * subNtk2;
    Vec_Int_t * oNonSingleton;    
    Vec_Ptr_t * oMatchPairs;
    int * skipList;
    int j, m;    
    int i;        
    static int counter = 0;

    MATCH_FOUND = FALSE;

    if( ii == Vec_IntSize(iNonSingleton) )
    {
        MATCH_FOUND = TRUE;
        return TRUE;
    }
    
    i = Vec_IntEntry(iNonSingleton, ii);

    if( idx == Vec_IntSize(iMatch1[i]) )
    {        
        // call again with the next element in iNonSingleton
        return match1by1(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                         pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                         matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton, ii+1, 0);            
        
    }    
    
    oNonSingleton = Vec_IntAlloc(10);
    oMatchPairs = Vec_PtrAlloc(100);    
    skipList = ABC_ALLOC(int, Vec_IntSize(iMatch1[i]));

    for(j = 0; j < Vec_IntSize(iMatch1[i]); j++)
        skipList[j] = FALSE;
    
    Vec_IntPush(matchedInputs1, Vec_IntEntry(iMatch1[i], idx));
    idx++;
    
    if(idx == 1)
    {
        for(j = 0; j < Vec_IntSize(iDep1[Vec_IntEntryLast(iMatch1[i])]); j++)
        {
            if( Vec_IntSize(oMatch1[oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]]) == 1 ) 
                continue;
            if( Vec_IntFind( oMatchedGroups, oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]) != -1)
                continue;
            
            Vec_IntPushUnique(oNonSingleton,  oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]);
            Vec_IntPushUnique(oMatchedGroups, oGroup1[Vec_IntEntry(iDep1[Vec_IntEntryLast(iMatch1[i])], j)]);        
        }
    }

    subNtk1 = computeCofactor(pNtk1, nodesInLevel1, NULL, matchedInputs1);

    for(j = idx-1; j < Vec_IntSize(iMatch2[i]) && MATCH_FOUND == FALSE; j++)
    {
        int tempJ;
        Vec_Int_t * mismatch;

        if( skipList[j] )
            continue;

        mismatch = Vec_IntAlloc(10);

        Vec_IntPush(matchedInputs2, Vec_IntEntry(iMatch2[i], j));        
        
        subNtk2 = computeCofactor(pNtk2, nodesInLevel2, NULL, matchedInputs2);            

        for(m = 0; m < Vec_IntSize(matchedOutputs1); m++)
        {
            Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk1, Vec_IntEntry(matchedOutputs1, m)));
            Vec_PtrPush(oMatchPairs, Abc_NtkPo(subNtk2, Vec_IntEntry(matchedOutputs2, m)));
        }

        counter++;

        if( Abc_NtkBmSat( subNtk2, subNtk1, NULL, oMatchPairs, mismatch, 0) )                
        {
            if(idx-1 != j)
            {
                tempJ = Vec_IntEntry(iMatch2[i], idx-1);
                Vec_IntWriteEntry(iMatch2[i], idx-1, Vec_IntEntry(iMatch2[i], j));
                Vec_IntWriteEntry(iMatch2[i], j, tempJ);
            }

            /*fprintf(matchFile, "%s matched to %s\n", Abc_ObjName(Abc_NtkPi(pNtk1, Vec_IntEntry(iMatch1[i], idx-1))), 
                                                      Abc_ObjName(Abc_NtkPi(pNtk2, Vec_IntEntry(iMatch2[i], j))));*/

            // we look for a match for outputs in oNonSingleton                                
            matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                     pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                                     matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton,                         
                                     subNtk1, subNtk2, oMatchPairs, oNonSingleton, 0, 0, ii, idx);
            
            
            if(idx-1 != j)
            {
                tempJ = Vec_IntEntry(iMatch2[i], idx-1);
                Vec_IntWriteEntry(iMatch2[i], idx-1, Vec_IntEntry(iMatch2[i], j));
                Vec_IntWriteEntry(iMatch2[i], j, tempJ);
            }
        }
        else
        {
            Abc_Ntk_t * FpNtk1, * FpNtk2;
            int * bitVector1, * bitVector2;
            Vec_Int_t * currInputs1, * currInputs2;            
            Vec_Ptr_t * vSupp;    
            Abc_Obj_t * pObj;
            int suppNum1 = 0;
            int * suppNum2;            
            
            bitVector1 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk1) );
            bitVector2 = ABC_ALLOC( int, Abc_NtkPiNum(pNtk2) );

            currInputs1 = Vec_IntAlloc(10);
            currInputs2 = Vec_IntAlloc(10);        
            
            suppNum2 = ABC_ALLOC(int, Vec_IntSize(iMatch2[i])-idx+1);

            for(m = 0; m < Abc_NtkPiNum(pNtk1); m++)
            {
                bitVector1[m] = 0;
                bitVector2[m] = 0;
            }

            for(m = 0; m < Vec_IntSize(iMatch2[i])-idx+1; m++)                        
                suppNum2[m]= 0;            

            // First of all set the value of the inputs that are already matched and are in mismatch
            for(m = 0; m < Vec_IntSize(mismatch); m += 2)
            {
                int n = Vec_IntEntry(mismatch, m);
                    
                bitVector1[Vec_IntEntry(matchedInputs1, n)] = Vec_IntEntry(mismatch, m+1);
                bitVector2[Vec_IntEntry(matchedInputs2, n)] = Vec_IntEntry(mismatch, m+1);
                
            }
            
            for(m = idx-1; m < Vec_IntSize(iMatch1[i]); m++)
            {
                Vec_IntPush(currInputs1, Vec_IntEntry(iMatch1[i], m));
                Vec_IntPush(currInputs2, Vec_IntEntry(iMatch2[i], m));
            }

            // Then add all the inputs that are not yet matched to the currInputs
            for(m = 0; m < Abc_NtkPiNum(pNtk1); m++)
            {
                if(Vec_IntFind( matchedInputs1, m ) == -1)
                    Vec_IntPushUnique(currInputs1, m);

                if(Vec_IntFind( matchedInputs2, m ) == -1)
                    Vec_IntPushUnique(currInputs2, m);
            }

            FpNtk1 = computeCofactor(pNtk1, nodesInLevel1, bitVector1, currInputs1);            
            FpNtk2 = computeCofactor(pNtk2, nodesInLevel2, bitVector2, currInputs2);    

            Abc_NtkForEachPo( FpNtk1, pObj, m )
            {        
                int n;
                vSupp  = Abc_NtkNodeSupport( FpNtk1, &pObj, 1 );                        
                
                for(n = 0; n < vSupp->nSize; n++)
                    if( Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n]) == 1 )
                        suppNum1 += Vec_IntFind( matchedOutputs1, m) + 1;                
                        
                Vec_PtrFree( vSupp );
            }
            
            Abc_NtkForEachPo( FpNtk2, pObj, m )
            {        
                int n;
                vSupp  = Abc_NtkNodeSupport( FpNtk2, &pObj, 1 );                        
                
                for(n = 0; n < vSupp->nSize; n++)
                    if( (int)Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n])-1 < (Vec_IntSize(iMatch2[i]))-idx+1 &&
                        (int)Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n])-1 >= 0)
                        suppNum2[Abc_ObjId((Abc_Obj_t *)vSupp->pArray[n])-1] += Vec_IntFind( matchedOutputs2, m) + 1;                
                        
                Vec_PtrFree( vSupp );
            }

            /*if(suppNum1 != 0)            
                printf("Ntk1 is trigged");            

            if(suppNum2[0] != 0)
                printf("Ntk2 is trigged");*/

            for(m = 0; m < Vec_IntSize(iMatch2[i])-idx+1; m++)
                if(suppNum2[m] != suppNum1)
                {
                    skipList[m+idx-1] = TRUE;                    
                    /*printf("input is skipped");*/
                }
                
            Abc_NtkDelete( FpNtk1 );
            Abc_NtkDelete( FpNtk2 );
            ABC_FREE( bitVector1 );    
             ABC_FREE( bitVector2 );    
            Vec_IntFree( currInputs1 );
            Vec_IntFree( currInputs2 );            
            ABC_FREE( suppNum2 );
        }
        
        Vec_PtrClear(oMatchPairs);
        Abc_NtkDelete( subNtk2 );
        Vec_IntFree(mismatch);

        //Vec_IntWriteEntry(iMatch2[i], j, tempJ);        
        
        if( MATCH_FOUND == FALSE )
            Vec_IntPop(matchedInputs2);
    }

    if( MATCH_FOUND == FALSE )
    {
        Vec_IntPop(matchedInputs1);    
        
        if(idx == 1)
        {
            for(m = 0; m < Vec_IntSize(oNonSingleton); m++)
                Vec_IntPop( oMatchedGroups );
        }
    }
    
    Vec_IntFree( oNonSingleton );    
    Vec_PtrFree( oMatchPairs );    
    ABC_FREE( skipList );
    Abc_NtkDelete( subNtk1 );    

    if(MATCH_FOUND && counter != 0)
    {        
        /*printf("Number of INPUT SAT instances = %d\n", counter);*/

        counter = 0;
    }

    return MATCH_FOUND;
}